

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BlockStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BlockStatement,slang::ast::Statement_const&,slang::ast::StatementBlockKind&,slang::SourceRange_const&>
          (BumpAllocator *this,Statement *args,StatementBlockKind *args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  BlockStatement *pBVar1;
  size_t in_RCX;
  Statement *in_RDX;
  BlockStatement *in_RSI;
  SourceLocation in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pBVar1 = (BlockStatement *)allocate((BumpAllocator *)in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = unaff_retaddr;
  sourceRange.startLoc = in_RDI;
  ast::BlockStatement::BlockStatement
            (in_RSI,in_RDX,(StatementBlockKind)(in_RCX >> 0x20),sourceRange);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }